

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_histogram(REF_DBL *metric,REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_INT *sorted_index_00;
  FILE *__stream;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_128;
  double local_120;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_e8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_c0;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  FILE *file;
  REF_INT *sorted_index;
  int local_a0;
  REF_INT n;
  REF_INT node;
  REF_INT i;
  REF_DBL diag_system [12];
  REF_DBL *eig;
  REF_NODE ref_node;
  char *filename_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc55,
           "ref_metric_histogram","malloc eig of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    diag_system[0xb] = (REF_DBL)malloc((long)pRVar1->n << 3);
    if ((void *)diag_system[0xb] == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xc55,"ref_metric_histogram","malloc eig of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->n;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        *(undefined8 *)((long)diag_system[0xb] + (long)ref_private_macro_code_rss * 8) = 0;
      }
      if (pRVar1->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xc56,"ref_metric_histogram","malloc sorted_index of REF_INT negative");
        metric_local._4_4_ = 1;
      }
      else {
        sorted_index_00 = (REF_INT *)malloc((long)pRVar1->n << 2);
        if (sorted_index_00 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xc56,"ref_metric_histogram","malloc sorted_index of REF_INT NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (local_c0 = 0; local_c0 < pRVar1->n; local_c0 = local_c0 + 1) {
            sorted_index_00[local_c0] = -1;
          }
          sorted_index._4_4_ = 0;
          for (local_a0 = 0; local_a0 < pRVar1->max; local_a0 = local_a0 + 1) {
            if (((-1 < local_a0) && (local_a0 < pRVar1->max)) && (-1 < pRVar1->global[local_a0])) {
              uVar2 = ref_matrix_diag_m(metric + local_a0 * 6,(REF_DBL *)&node);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xc59,"ref_metric_histogram",(ulong)uVar2,"decomp");
                return uVar2;
              }
              if (_node <= 0.0) {
                local_e8 = -_node;
              }
              else {
                local_e8 = _node;
              }
              if (diag_system[0] <= 0.0) {
                local_f8 = -diag_system[0];
              }
              else {
                local_f8 = diag_system[0];
              }
              if (local_e8 <= local_f8) {
                if (diag_system[0] <= 0.0) {
                  local_110 = -diag_system[0];
                }
                else {
                  local_110 = diag_system[0];
                }
                local_108 = local_110;
              }
              else {
                if (_node <= 0.0) {
                  local_100 = -_node;
                }
                else {
                  local_100 = _node;
                }
                local_108 = local_100;
              }
              if (diag_system[1] <= 0.0) {
                local_120 = -diag_system[1];
              }
              else {
                local_120 = diag_system[1];
              }
              if (local_108 <= local_120) {
                if (diag_system[1] <= 0.0) {
                  local_160 = -diag_system[1];
                }
                else {
                  local_160 = diag_system[1];
                }
                local_158 = local_160;
              }
              else {
                if (_node <= 0.0) {
                  local_128 = -_node;
                }
                else {
                  local_128 = _node;
                }
                if (diag_system[0] <= 0.0) {
                  local_138 = -diag_system[0];
                }
                else {
                  local_138 = diag_system[0];
                }
                if (local_128 <= local_138) {
                  if (diag_system[0] <= 0.0) {
                    local_150 = -diag_system[0];
                  }
                  else {
                    local_150 = diag_system[0];
                  }
                  local_148 = local_150;
                }
                else {
                  if (_node <= 0.0) {
                    local_140 = -_node;
                  }
                  else {
                    local_140 = _node;
                  }
                  local_148 = local_140;
                }
                local_158 = local_148;
              }
              *(double *)((long)diag_system[0xb] + (long)sorted_index._4_4_ * 8) = local_158;
              sorted_index._4_4_ = sorted_index._4_4_ + 1;
            }
          }
          if ((long)pRVar1->n == (long)sorted_index._4_4_) {
            metric_local._4_4_ =
                 ref_sort_heap_dbl(sorted_index._4_4_,(REF_DBL *)diag_system[0xb],sorted_index_00);
            if (metric_local._4_4_ == 0) {
              __stream = fopen(filename,"w");
              if (__stream == (FILE *)0x0) {
                printf("unable to open %s\n",filename);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xc64,"ref_metric_histogram","unable to open file");
                metric_local._4_4_ = 2;
              }
              else {
                fprintf(__stream,"title=\"tecplot ordered max eig\"\n");
                fprintf(__stream,"variables = \"i\" \"e\"\n");
                fprintf(__stream,"zone t=\"eig\"\n");
                for (n = 0; n < sorted_index._4_4_; n = n + 1) {
                  fprintf(__stream,"%d %e\n",
                          *(undefined8 *)((long)diag_system[0xb] + (long)sorted_index_00[n] * 8),
                          (ulong)(uint)n);
                }
                fclose(__stream);
                if (sorted_index_00 != (REF_INT *)0x0) {
                  free(sorted_index_00);
                }
                if (diag_system[0xb] != 0.0) {
                  free((void *)diag_system[0xb]);
                }
                metric_local._4_4_ = 0;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xc60,"ref_metric_histogram",(ulong)metric_local._4_4_,"sort");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xc5f,"ref_metric_histogram","node count",(long)pRVar1->n,
                   (long)sorted_index._4_4_);
            metric_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_histogram(REF_DBL *metric, REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *eig, diag_system[12];
  REF_INT i, node, n, *sorted_index;
  FILE *file;

  ref_malloc_init(eig, ref_node_n(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sorted_index, ref_node_n(ref_node), REF_INT, REF_EMPTY);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
    eig[n] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                     ABS(ref_matrix_eig(diag_system, 1))),
                 ABS(ref_matrix_eig(diag_system, 2)));
    n++;
  }
  REIS(ref_node_n(ref_node), n, "node count");
  RSS(ref_sort_heap_dbl(n, eig, sorted_index), "sort");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot ordered max eig\"\n");
  fprintf(file, "variables = \"i\" \"e\"\n");
  fprintf(file, "zone t=\"eig\"\n");
  for (i = 0; i < n; i++) {
    fprintf(file, "%d %e\n", i, eig[sorted_index[i]]);
  }
  fclose(file);
  ref_free(sorted_index);
  ref_free(eig);
  return REF_SUCCESS;
}